

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O0

ParameterError parse_upload_flags(OperationConfig *config,char *flag)

{
  char cVar1;
  int iVar2;
  char *local_38;
  char *next;
  size_t len;
  flagmap *map;
  _Bool negate;
  char *pcStack_18;
  ParameterError err;
  char *flag_local;
  OperationConfig *config_local;
  
  pcStack_18 = flag;
  do {
    if (pcStack_18 == (char *)0x0) {
      return PARAM_OK;
    }
    local_38 = strchr(pcStack_18,0x2c);
    if (local_38 == (char *)0x0) {
      next = (char *)strlen(pcStack_18);
    }
    else {
      next = local_38 + -(long)pcStack_18;
    }
    cVar1 = *pcStack_18;
    if (cVar1 == '-') {
      pcStack_18 = pcStack_18 + 1;
      next = next + -1;
    }
    for (len = (size_t)flag_table; *(long *)len != 0; len = len + 0x18) {
      if ((next == *(char **)(len + 8)) &&
         (iVar2 = strncmp(pcStack_18,*(char **)len,*(size_t *)(len + 8)), iVar2 == 0)) {
        if (cVar1 == '-') {
          config->upload_flags = config->upload_flags & (*(byte *)(len + 0x10) ^ 0xff);
        }
        else {
          config->upload_flags = config->upload_flags | *(byte *)(len + 0x10);
        }
        break;
      }
    }
    if (*(long *)len == 0) {
      return PARAM_OPTION_UNKNOWN;
    }
    if (local_38 != (char *)0x0) {
      local_38 = local_38 + 1;
    }
    pcStack_18 = local_38;
  } while( true );
}

Assistant:

static ParameterError parse_upload_flags(struct OperationConfig *config,
                                         const char *flag)
{
  ParameterError err = PARAM_OK;

  while(flag) {
    bool negate;
    const struct flagmap *map;
    size_t len;
    char *next = strchr(flag, ','); /* Find next comma or end */
    if(next)
      len = next - flag;
    else
      len = strlen(flag);

    negate = (*flag == '-');
    if(negate) {
      flag++;
      len--;
    }

    for(map = flag_table; map->name; map++) {
      if((len == map->len) && !strncmp(flag, map->name, map->len)) {
        if(negate)
          config->upload_flags &= (unsigned char)~map->flag;
        else
          config->upload_flags |= map->flag;
        break;
      }
    }

   if(!map->name) {
     err = PARAM_OPTION_UNKNOWN;
     break;
   }

   if(next)
     /* move over the comma */
     next++;
   flag = next;
  }

  return err;
}